

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O3

ExpressionResultBuilder * __thiscall
Catch::ExpressionLhs<char_const&>::captureExpression<(Catch::Internal::Operator)0,int>
          (ExpressionLhs<char_const&> *this,int *rhs)

{
  char cVar1;
  int iVar2;
  undefined4 uVar3;
  string local_1d0;
  undefined1 *local_1b0;
  undefined1 local_1a0 [16];
  undefined1 *local_190 [2];
  undefined1 local_180 [96];
  ios_base local_120 [264];
  
  uVar3 = 0x11;
  if (*rhs == (int)**(char **)(this + 0x228)) {
    uVar3 = 0;
  }
  *(undefined4 *)(this + 0x40) = uVar3;
  cVar1 = **(char **)(this + 0x228);
  local_190[0] = (undefined1 *)CONCAT71(local_190[0]._1_7_,cVar1);
  if (cVar1 < ' ') {
    toString_abi_cxx11_(&local_1d0,(Catch *)(ulong)(uint)(int)cVar1,0);
  }
  else {
    Detail::StringMakerBase<true>::convert<char>(&local_1d0,(char *)local_190);
  }
  std::__cxx11::string::_M_assign((string *)(this + 0x50));
  iVar2 = *rhs;
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_190);
  std::ostream::operator<<(local_190,iVar2);
  std::__cxx11::stringbuf::str();
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_190);
  std::ios_base::~ios_base(local_120);
  std::__cxx11::string::_M_assign((string *)(this + 0x70));
  local_190[0] = local_180;
  std::__cxx11::string::_M_construct<char_const*>((string *)local_190,"==","");
  std::__cxx11::string::_M_assign((string *)(this + 0x90));
  if (local_190[0] != local_180) {
    operator_delete(local_190[0]);
  }
  if (local_1b0 != local_1a0) {
    operator_delete(local_1b0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_1d0._M_dataplus._M_p != &local_1d0.field_2) {
    operator_delete(local_1d0._M_dataplus._M_p);
  }
  return (ExpressionResultBuilder *)this;
}

Assistant:

ExpressionResultBuilder& captureExpression( RhsT const& rhs ) {
        return m_result
            .setResultType( Internal::compare<Op>( m_lhs, rhs ) )
            .setLhs( Catch::toString( m_lhs ) )
            .setRhs( Catch::toString( rhs ) )
            .setOp( Internal::OperatorTraits<Op>::getName() );
    }